

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DFA.h
# Opt level: O3

void __thiscall covenant::DFA<covenant::Sym>::eps_close(DFA<covenant::Sym> *this,int state)

{
  vector<int,std::allocator<int>> *this_00;
  uint uVar1;
  iterator __position;
  bool bVar2;
  pointer pvVar3;
  uint uVar4;
  pointer piVar5;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  int *__args;
  SparseSet<0> reach;
  SparseSet<0> local_58;
  
  local_58.dom = (int)((long)(this->trans).
                             super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_finish -
                       (long)(this->trans).
                             super__Vector_base<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>,_std::allocator<std::vector<covenant::DFA<covenant::Sym>::Edge,_std::allocator<covenant::DFA<covenant::Sym>::Edge>_>_>_>
                             ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x55555555;
  local_58._vptr_SparseSet = (_func_int **)&PTR_insert_001a8f80;
  uVar7 = (ulong)local_58.dom;
  local_58.sparse = (uint *)operator_new__(uVar7 << 2);
  local_58.dense = (uint *)operator_new__(uVar7 << 2);
  local_58.members = 0;
  SparseSet<0>::insert(&local_58,state);
  pvVar3 = (this->eps).
           super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  piVar5 = pvVar3[state].super__Vector_base<int,_std::allocator<int>_>._M_impl.
           super__Vector_impl_data._M_start;
  if (*(pointer *)
       ((long)&pvVar3[state].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data + 8) != piVar5) {
    uVar7 = 0;
    uVar6 = 1;
    do {
      uVar4 = piVar5[uVar7];
      if ((local_58.members <= local_58.sparse[uVar4]) ||
         (local_58.dense[local_58.sparse[uVar4]] != uVar4)) {
        SparseSet<0>::insert(&local_58,uVar4);
        pvVar3 = (this->eps).
                 super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
      }
      piVar5 = pvVar3[state].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      bVar2 = uVar6 < (ulong)((long)*(pointer *)
                                     ((long)&pvVar3[state].
                                             super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                             super__Vector_impl_data + 8) - (long)piVar5 >> 2);
      uVar7 = uVar6;
      uVar6 = (ulong)((int)uVar6 + 1);
    } while (bVar2);
  }
  if (1 < local_58.members) {
    uVar7 = 1;
    uVar4 = local_58.members;
    do {
      uVar1 = local_58.dense[uVar7];
      piVar5 = pvVar3[(int)uVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start;
      if (*(pointer *)
           ((long)&pvVar3[(int)uVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data + 8) != piVar5) {
        uVar8 = 1;
        uVar6 = 0;
        do {
          uVar4 = piVar5[uVar6];
          if ((local_58.members <= local_58.sparse[uVar4]) ||
             (local_58.dense[local_58.sparse[uVar4]] != uVar4)) {
            SparseSet<0>::insert(&local_58,uVar4);
            pvVar3 = (this->eps).
                     super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_start;
            __args = (int *)(uVar6 * 4 +
                            *(long *)&pvVar3[(int)uVar1].
                                      super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                      super__Vector_impl_data);
            this_00 = (vector<int,std::allocator<int>> *)(pvVar3 + state);
            __position._M_current = *(int **)(this_00 + 8);
            if (__position._M_current == *(int **)(this_00 + 0x10)) {
              std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                        (this_00,__position,__args);
              pvVar3 = (this->eps).
                       super__Vector_base<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start;
            }
            else {
              *__position._M_current = *__args;
              *(int **)(this_00 + 8) = __position._M_current + 1;
            }
          }
          uVar6 = (ulong)uVar8;
          piVar5 = pvVar3[(int)uVar1].super__Vector_base<int,_std::allocator<int>_>._M_impl.
                   super__Vector_impl_data._M_start;
          uVar8 = uVar8 + 1;
          uVar4 = local_58.members;
        } while (uVar6 < (ulong)((long)*(pointer *)
                                        ((long)&pvVar3[(int)uVar1].
                                                super__Vector_base<int,_std::allocator<int>_>.
                                                _M_impl.super__Vector_impl_data + 8) - (long)piVar5
                                >> 2));
      }
      uVar7 = uVar7 + 1;
    } while (uVar7 < uVar4);
  }
  SparseSet<0>::~SparseSet(&local_58);
  return;
}

Assistant:

void eps_close(int state)
    {
      SparseSet<> reach(nStates());
      reach.insert(state);
      for(unsigned int ei = 0; ei < eps[state].size(); ei++)
      {
        // Added the conditional test after observing some problems
        // running the CFG solver.
        if(!reach.elem(eps[state][ei]))
          reach.insert(eps[state][ei]);
      }

      for(unsigned int ii = 1; ii < reach.size(); ii++)
      {
        int es = reach[ii];
        for(unsigned int ei = 0; ei < eps[es].size(); ei++)
        {
          // Not yet processed
          if(!reach.elem(eps[es][ei]))
          { 
            reach.insert(eps[es][ei]);
            eps[state].push_back(eps[es][ei]);
          }
        }
      }
    }